

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

pair<bool,_const_char_*> consistentNumberProperty(char *lhs,char *rhs,CompatibleType t)

{
  int *piVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  long *plVar2;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 uVar3;
  pair<bool,_const_char_*> pVar4;
  char **local_80;
  char **local_78;
  bool local_6a;
  bool local_69;
  void *local_68;
  bool local_59;
  long local_58;
  long rnum;
  bool local_41;
  long local_40;
  long lnum;
  char *pEnd;
  char *pcStack_28;
  CompatibleType t_local;
  char *rhs_local;
  char *lhs_local;
  char *local_10;
  
  pEnd._4_4_ = t;
  pcStack_28 = rhs;
  rhs_local = lhs;
  local_40 = strtol(lhs,(char **)&lnum,0);
  if (((char *)lnum != rhs_local) && (*(char *)lnum == '\0')) {
    piVar1 = __errno_location();
    if (*piVar1 != 0x22) {
      local_58 = strtol(pcStack_28,(char **)&lnum,0);
      if (((char *)lnum != pcStack_28) && (*(char *)lnum == '\0')) {
        piVar1 = __errno_location();
        if (*piVar1 != 0x22) {
          if (pEnd._4_4_ == NumberMaxType) {
            local_69 = true;
            plVar2 = std::max<long>(&local_40,&local_58);
            if (*plVar2 == local_40) {
              local_78 = &rhs_local;
            }
            else {
              local_78 = &stack0xffffffffffffffd8;
            }
            std::pair<bool,_const_char_*>::pair<bool,_const_char_*&,_true>
                      ((pair<bool,_const_char_*> *)&lhs_local,&local_69,local_78);
            uVar3 = extraout_RAX_01;
          }
          else {
            local_6a = true;
            plVar2 = std::min<long>(&local_40,&local_58);
            if (*plVar2 == local_40) {
              local_80 = &rhs_local;
            }
            else {
              local_80 = &stack0xffffffffffffffd8;
            }
            std::pair<bool,_const_char_*>::pair<bool,_const_char_*&,_true>
                      ((pair<bool,_const_char_*> *)&lhs_local,&local_6a,local_80);
            uVar3 = extraout_RAX_02;
          }
          goto LAB_00826896;
        }
      }
      local_59 = false;
      local_68 = (void *)0x0;
      std::pair<bool,_const_char_*>::pair<bool,_std::nullptr_t,_true>
                ((pair<bool,_const_char_*> *)&lhs_local,&local_59,&local_68);
      uVar3 = extraout_RAX_00;
      goto LAB_00826896;
    }
  }
  local_41 = false;
  rnum = 0;
  std::pair<bool,_const_char_*>::pair<bool,_std::nullptr_t,_true>
            ((pair<bool,_const_char_*> *)&lhs_local,&local_41,(void **)&rnum);
  uVar3 = extraout_RAX;
LAB_00826896:
  pVar4._1_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.first = (bool)lhs_local._0_1_;
  pVar4.second = local_10;
  return pVar4;
}

Assistant:

static std::pair<bool, const char*> consistentNumberProperty(const char* lhs,
                                                             const char* rhs,
                                                             CompatibleType t)
{
  char* pEnd;

  long lnum = strtol(lhs, &pEnd, 0);
  if (pEnd == lhs || *pEnd != '\0' || errno == ERANGE) {
    return { false, nullptr };
  }

  long rnum = strtol(rhs, &pEnd, 0);
  if (pEnd == rhs || *pEnd != '\0' || errno == ERANGE) {
    return { false, nullptr };
  }

  if (t == NumberMaxType) {
    return { true, std::max(lnum, rnum) == lnum ? lhs : rhs };
  }

  return { true, std::min(lnum, rnum) == lnum ? lhs : rhs };
}